

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32.c
# Opt level: O3

void elf32_writeshdrs(GlobalVars *gv,FILE *f,uint32_t reloffset,uint32_t stabndx)

{
  void *p;
  uint32_t uVar1;
  node *pnVar2;
  LinkedSection *pLVar3;
  uint be;
  node **p_00;
  bool bVar4;
  
  bVar4 = elf_endianess == '\x01';
  pnVar2 = remhead(&shdrlist);
  do {
    if (pnVar2 == (node *)0x0) {
      return;
    }
    be = (uint)bVar4;
    uVar1 = read32(be,(void *)((long)&pnVar2[1].next + 4));
    if (uVar1 == 9) {
LAB_0011d599:
      uVar1 = read32(be,&pnVar2[1].pred);
      if ((uVar1 & 2) == 0) {
        uVar1 = read32(be,pnVar2 + 2);
        write32(be,pnVar2 + 2,uVar1 + reloffset);
        p_00 = &pnVar2[2].pred;
        uVar1 = stabndx;
LAB_0011d72f:
        write32(be,p_00,uVar1);
      }
      else {
        pLVar3 = find_lnksec(gv,".dynsym",'\0','\0','\0','\0');
        if (pLVar3 == (LinkedSection *)0x0) {
          ierror("%s %s","elf32_writeshdrs():",".dynsym");
        }
        else {
          write32(be,&pnVar2[2].pred,pLVar3->index);
        }
        p = (void *)((long)&pnVar2[2].pred + 4);
        uVar1 = read32(be,p);
        if (uVar1 != 0) {
          pLVar3 = find_lnksec(gv,".plt",'\0','\0','\0','\0');
          if (pLVar3 == (LinkedSection *)0x0) {
            ierror("%s %s","elf32_writeshdrs():",".plt");
          }
          else {
            write32(be,p,pLVar3->index);
          }
        }
      }
    }
    else if (uVar1 == 5) {
      pLVar3 = find_lnksec(gv,".dynsym",'\0','\0','\0','\0');
      if (pLVar3 != (LinkedSection *)0x0) {
        p_00 = &pnVar2[2].pred;
        uVar1 = pLVar3->index;
        goto LAB_0011d72f;
      }
      ierror("%s %s","elf32_writeshdrs():",".dynsym");
    }
    else {
      if (uVar1 == 4) goto LAB_0011d599;
      if ((uVar1 == 0xb) || (uVar1 == 6)) {
        pLVar3 = find_lnksec(gv,".dynstr",'\0','\0','\0','\0');
        if (pLVar3 == (LinkedSection *)0x0) {
          ierror("%s %s","elf32_writeshdrs():",".dynstr");
        }
        else {
          write32(be,&pnVar2[2].pred,pLVar3->index);
        }
        if (uVar1 == 0xb) {
          p_00 = (node **)((long)&pnVar2[2].pred + 4);
          uVar1 = 1;
          goto LAB_0011d72f;
        }
      }
    }
    fwritex(f,pnVar2 + 1,0x28);
    pnVar2 = remhead(&shdrlist);
  } while( true );
}

Assistant:

static void elf32_writeshdrs(struct GlobalVars *gv,FILE *f,
                             uint32_t reloffset,uint32_t stabndx)
/* write all section headers */
{
  const char *fn = "elf32_writeshdrs():";
  bool be = elf_endianess == _BIG_ENDIAN_;
  struct LinkedSection *ls;
  struct ShdrNode *shn;
  uint32_t type;

  while (shn = (struct ShdrNode *)remhead(&shdrlist)) {
    type = read32(be,shn->s.sh_type);

    /* handle REL and RELA sections */
    if (type == SHT_RELA || type == SHT_REL) {
      if (read32(be,shn->s.sh_flags) & SHF_ALLOC) {
        /* allocated, so probably dynamic relocs: link to .dynsym */
        if (ls = find_lnksec(gv,dynsym_name,0,0,0,0))
          write32(be,shn->s.sh_link,(uint32_t)ls->index);
        else
          ierror("%s %s",fn,dynsym_name);

        if (read32(be,shn->s.sh_info) != 0) {
          /* link to .plt requested in info field */
          if (ls = find_lnksec(gv,plt_name,0,0,0,0))
            write32(be,shn->s.sh_info,(uint32_t)ls->index);
          else
            ierror("%s %s",fn,plt_name);
        }
      }
      else {
        /* patch correct sh_offset and sh_link for reloc header */
        write32(be,shn->s.sh_offset,read32(be,shn->s.sh_offset)+reloffset);
        write32(be,shn->s.sh_link,stabndx);
      }
    }

    /* handle HASH sections, which need a .dynsym link */
    else if (type == SHT_HASH) {
      if (ls = find_lnksec(gv,dynsym_name,0,0,0,0))
        write32(be,shn->s.sh_link,(uint32_t)ls->index);
      else
        ierror("%s %s",fn,dynsym_name);
    }

    /* handle DYNAMIC and DYNSYM sections */
    else if (type==SHT_DYNAMIC || type==SHT_DYNSYM) {
      /* write .dynstr link */
      if (ls = find_lnksec(gv,dynstr_name,0,0,0,0))
        write32(be,shn->s.sh_link,(uint32_t)ls->index);
      else
        ierror("%s %s",fn,dynstr_name);

      if (type == SHT_DYNSYM) {
        write32(be,shn->s.sh_info,1);  /* @@ FIXME! number of local symbols */
      }
    }

    fwritex(f,&shn->s,sizeof(struct Elf32_Shdr));
  }
}